

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O3

MMFWEntry * MMFW_EntryAtIndex(MMFW *mmfw,int i)

{
  MMFWKind MVar1;
  MMFWEntry *pMVar2;
  MMFWSoundEntry *pMVar3;
  
  pMVar2 = (MMFWEntry *)malloc(0x10);
  if (pMVar2 != (MMFWEntry *)0x0) {
    MVar1 = mmfw->kind;
    pMVar2->kind = MVar1;
    if (MVar1 == MMFW_KIND_FILMS) {
      pMVar3 = (MMFWSoundEntry *)MMFWFilmEntry_New(mmfw,i);
    }
    else if (MVar1 == MMFW_KIND_PICTURES) {
      pMVar3 = (MMFWSoundEntry *)MMFWPictureEntry_New(mmfw,i);
    }
    else {
      if (MVar1 != MMFW_KIND_SOUNDS) {
        return pMVar2;
      }
      pMVar3 = MMFWSoundEntry_New(mmfw,i);
    }
    (pMVar2->entry).sound = pMVar3;
  }
  return pMVar2;
}

Assistant:

MMFWEntry *
MMFW_EntryAtIndex(MMFW *mmfw, int i)
{
	MMFWEntry *entry = malloc(sizeof(MMFWEntry));

	if (!entry) {
		return NULL;
	}

	entry->kind = mmfw->kind;

	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		entry->entry.sound = MMFWSoundEntry_New(mmfw, i);
		break;
	case MMFW_KIND_PICTURES:
		entry->entry.picture = MMFWPictureEntry_New(mmfw, i);
		break;
	case MMFW_KIND_FILMS:
		entry->entry.film = MMFWFilmEntry_New(mmfw, i);
		break;
	default:
		; /* XXX NOTREACHED */
	}

	return entry;
}